

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O1

void null_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                 JDIMENSION output_row,int num_rows)

{
  int iVar1;
  uint uVar2;
  JSAMPROW pJVar3;
  bool bVar4;
  JSAMPLE *pJVar5;
  long lVar6;
  ulong uVar7;
  
  if (0 < num_rows) {
    iVar1 = cinfo->num_components;
    uVar2 = cinfo->image_width;
    do {
      if (0 < iVar1) {
        lVar6 = 0;
        do {
          if ((ulong)uVar2 != 0) {
            pJVar3 = output_buf[lVar6][output_row];
            pJVar5 = *input_buf + lVar6;
            uVar7 = 0;
            do {
              pJVar3[uVar7] = *pJVar5;
              uVar7 = uVar7 + 1;
              pJVar5 = pJVar5 + iVar1;
            } while (uVar2 != uVar7);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != iVar1);
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
      bVar4 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar4);
  }
  return;
}

Assistant:

METHODDEF(void)
null_convert (j_compress_ptr cinfo,
	      JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
	      JDIMENSION output_row, int num_rows)
{
  register JSAMPROW inptr;
  register JSAMPROW outptr;
  register JDIMENSION col;
  register int ci;
  int nc = cinfo->num_components;
  JDIMENSION num_cols = cinfo->image_width;

  while (--num_rows >= 0) {
    /* It seems fastest to make a separate pass for each component. */
    for (ci = 0; ci < nc; ci++) {
      inptr = *input_buf;
      outptr = output_buf[ci][output_row];
      for (col = 0; col < num_cols; col++) {
	outptr[col] = inptr[ci]; /* don't need GETJSAMPLE() here */
	inptr += nc;
      }
    }
    input_buf++;
    output_row++;
  }
}